

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O0

void fsnav_ins_attitude_madgwick(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double local_190;
  double g2;
  double g1;
  double g0;
  size_t i;
  double vector2_4 [4];
  double vector1_4 [4];
  double f_madgwick [3];
  double local_f8;
  double J_madgwick [3] [4];
  double a_madgwick [3];
  double local_78;
  double w_madgwick [4];
  double dt;
  double s;
  double a [3];
  double epsilon;
  char madgwick_token [23];
  char *cfg_ptr;
  
  epsilon = (double)0x6b6369776764616d;
  builtin_strncpy(madgwick_token,"_feedback_rate",0xf);
  a[2] = 9.5367431640625e-07;
  if (fsnav->mode == 0) {
    if (fsnav->imu != (fsnav_imu *)0x0) {
      (fsnav->imu->sol).q_valid = '\0';
      (fsnav->imu->sol).L_valid = '\0';
      (fsnav->imu->sol).rpy_valid = '\0';
      fsnav_ins_attitude_madgwick::L = (fsnav->imu->sol).L;
      g0 = 4.94065645841247e-324;
      (fsnav->imu->sol).q[0] = 1.0;
      for (; (ulong)g0 < 4; g0 = (double)((long)g0 + 1)) {
        (fsnav->imu->sol).q[(long)g0] = 0.0;
      }
      (fsnav->imu->sol).q_valid = '\x01';
      fsnav_linal_quat2mat(fsnav_ins_attitude_madgwick::L,(fsnav->imu->sol).q);
      (fsnav->imu->sol).L_valid = '\x01';
      fsnav_linal_mat2rpy((fsnav->imu->sol).rpy,fsnav_ins_attitude_madgwick::L);
      (fsnav->imu->sol).rpy_valid = '\x01';
      fsnav_ins_attitude_madgwick::t0 = -1.0;
      register0x00000000 =
           fsnav_locate_token((char *)&epsilon,fsnav->imu->cfg,fsnav->imu->cfglength,'=');
      if (register0x00000000 != (char *)0x0) {
        dVar34 = atof(register0x00000000);
        fsnav_ins_attitude_madgwick::feedback_rate = dVar34 / (fsnav->imu_const).rad2deg;
      }
    }
  }
  else if ((((-1 < fsnav->mode) && ((fsnav->imu->sol).L_valid != '\0')) &&
           (fsnav->imu->w_valid != '\0')) && (fsnav->imu->f_valid != '\0')) {
    if (fsnav_ins_attitude_madgwick::t0 < 0.0) {
      fsnav_ins_attitude_madgwick::t0 = fsnav->imu->t;
    }
    else {
      w_madgwick[3] = fsnav->imu->t - fsnav_ins_attitude_madgwick::t0;
      fsnav_ins_attitude_madgwick::t0 = fsnav->imu->t;
      for (g0 = 0.0; (ulong)g0 < 3; g0 = (double)((long)g0 + 1)) {
        w_madgwick[(long)g0] = fsnav->imu->w[(long)g0];
      }
      local_78 = 0.0;
      for (g0 = 0.0; (ulong)g0 < 3; g0 = (double)((long)g0 + 1)) {
        a_madgwick[(long)g0 + -1] = fsnav->imu->f[(long)g0];
      }
      dVar35 = fsnav_linal_vnorm(J_madgwick[2] + 3,3);
      dVar34 = (fsnav->imu->sol).q[2];
      dVar36 = (fsnav->imu->sol).q[2];
      dVar37 = (fsnav->imu->sol).q[3];
      dVar1 = (fsnav->imu->sol).q[3];
      dVar2 = (fsnav->imu->sol).q[0];
      dVar3 = (fsnav->imu->sol).q[3];
      dVar4 = (fsnav->imu->sol).q[1];
      dVar5 = (fsnav->imu->sol).q[2];
      dVar6 = (fsnav->imu->sol).q[1];
      dVar7 = (fsnav->imu->sol).q[3];
      dVar8 = (fsnav->imu->sol).q[0];
      dVar9 = (fsnav->imu->sol).q[2];
      dVar10 = (fsnav->imu->sol).q[1];
      dVar11 = (fsnav->imu->sol).q[2];
      dVar12 = (fsnav->imu->sol).q[0];
      dVar13 = (fsnav->imu->sol).q[3];
      dVar14 = (fsnav->imu->sol).q[1];
      dVar15 = (fsnav->imu->sol).q[1];
      dVar16 = (fsnav->imu->sol).q[3];
      dVar17 = (fsnav->imu->sol).q[3];
      dVar18 = (fsnav->imu->sol).q[0];
      dVar19 = (fsnav->imu->sol).q[1];
      dVar20 = (fsnav->imu->sol).q[2];
      dVar21 = (fsnav->imu->sol).q[3];
      dVar22 = (fsnav->imu->sol).q[0];
      dVar23 = (fsnav->imu->sol).q[2];
      dVar24 = (fsnav->imu->sol).q[1];
      dVar25 = (fsnav->imu->sol).q[3];
      dVar26 = (fsnav->imu->sol).q[2];
      dVar27 = (fsnav->imu->sol).q[3];
      dVar28 = (fsnav->imu->sol).q[0];
      dVar29 = (fsnav->imu->sol).q[1];
      dVar30 = (fsnav->imu->sol).q[1];
      dVar31 = (fsnav->imu->sol).q[1];
      dVar32 = (fsnav->imu->sol).q[2];
      dVar33 = (fsnav->imu->sol).q[2];
      J_madgwick[0][0] = (fsnav->imu->sol).q[2] * 0.0 + (fsnav->imu->sol).q[3] * 2.0;
      J_madgwick[0][1] =
           (fsnav->imu->sol).q[0] * -2.0 +
           (fsnav->imu->sol).q[2] * -0.0 + (fsnav->imu->sol).q[1] * 0.0;
      J_madgwick[0][2] =
           (fsnav->imu->sol).q[1] * 2.0 +
           (fsnav->imu->sol).q[3] * -0.0 + (fsnav->imu->sol).q[0] * 0.0;
      J_madgwick[0][3] = (fsnav->imu->sol).q[3] * -0.0 + (fsnav->imu->sol).q[1] * 2.0;
      J_madgwick[1][0] =
           (fsnav->imu->sol).q[0] * 2.0 +
           (fsnav->imu->sol).q[2] * 0.0 + -((fsnav->imu->sol).q[1] * 0.0);
      J_madgwick[1][1] = (fsnav->imu->sol).q[1] * 0.0 + (fsnav->imu->sol).q[3] * 2.0;
      J_madgwick[1][2] =
           (fsnav->imu->sol).q[2] * 2.0 +
           (fsnav->imu->sol).q[0] * -0.0 + -((fsnav->imu->sol).q[3] * 0.0);
      J_madgwick[1][3] = (fsnav->imu->sol).q[2] * 0.0 + -((fsnav->imu->sol).q[1] * 0.0);
      J_madgwick[2][0] =
           (fsnav->imu->sol).q[1] * -4.0 +
           (fsnav->imu->sol).q[3] * 0.0 + -((fsnav->imu->sol).q[0] * 0.0);
      J_madgwick[2][1] =
           (fsnav->imu->sol).q[2] * -4.0 +
           (fsnav->imu->sol).q[0] * 0.0 + (fsnav->imu->sol).q[3] * 0.0;
      J_madgwick[2][2] = (fsnav->imu->sol).q[1] * 0.0 + (fsnav->imu->sol).q[2] * 0.0;
      for (g0 = 0.0; (ulong)g0 < 4; g0 = (double)((long)g0 + 1)) {
        vector2_4[(long)g0 + 3] =
             a_madgwick[(long)g0 + -5] *
             (((-dVar32 * dVar33 + -dVar30 * dVar31 + 0.5) * 2.0 +
              (dVar22 * dVar23 + dVar24 * dVar25) * 0.0 +
              (dVar26 * dVar27 + -(dVar28 * dVar29)) * 0.0) - a_madgwick[1] / dVar35) +
             J_madgwick[-1][(long)g0 + 3] *
             (((dVar6 * dVar7 + -(dVar8 * dVar9)) * 2.0 +
              (-dVar37 * dVar1 + -dVar34 * dVar36 + 0.5) * 0.0 +
              (dVar2 * dVar3 + dVar4 * dVar5) * 0.0) - J_madgwick[2][3] / dVar35) +
             a_madgwick[(long)g0 + -9] *
             (((dVar18 * dVar19 + dVar20 * dVar21) * 2.0 +
              (dVar10 * dVar11 + -(dVar12 * dVar13)) * 0.0 +
              (-dVar16 * dVar17 + -dVar14 * dVar15 + 0.5) * 0.0) - a_madgwick[0] / dVar35);
      }
      fsnav_linal_qmul((double *)&i,(fsnav->imu->sol).q,&local_78);
      for (g0 = 0.0; (ulong)g0 < 4; g0 = (double)((long)g0 + 1)) {
        dVar34 = vector2_4[(long)g0 + -1];
        dVar36 = fsnav_ins_attitude_madgwick::feedback_rate * vector2_4[(long)g0 + 3];
        dVar37 = fsnav_linal_vnorm(vector2_4 + 3,4);
        (fsnav->imu->sol).q[(long)g0] =
             (dVar34 - dVar36 / (dVar37 + 9.5367431640625e-07)) * 0.5 * w_madgwick[3] +
             (fsnav->imu->sol).q[(long)g0];
      }
      dVar34 = fsnav_linal_vnorm((fsnav->imu->sol).q,4);
      for (g0 = 0.0; (ulong)g0 < 4; g0 = (double)((long)g0 + 1)) {
        (fsnav->imu->sol).q[(long)g0] = (fsnav->imu->sol).q[(long)g0] / dVar34;
      }
      fsnav_linal_quat2mat(fsnav_ins_attitude_madgwick::L,(fsnav->imu->sol).q);
      for (g0 = 0.0; (ulong)g0 < 3; g0 = (double)((long)g0 + 1)) {
        if (fsnav->imu->W_valid == '\0') {
          local_190 = 0.0;
        }
        else {
          local_190 = fsnav->imu->W[(long)g0];
        }
        a[(long)g0 + -1] = local_190;
      }
      if ((fsnav->imu->sol).llh_valid != '\0') {
        dVar34 = (fsnav->imu_const).u;
        dVar36 = cos((fsnav->imu->sol).llh[1]);
        a[0] = dVar34 * dVar36 + a[0];
        dVar34 = (fsnav->imu_const).u;
        dVar36 = sin((fsnav->imu->sol).llh[1]);
        a[1] = dVar34 * dVar36 + a[1];
      }
      for (g0 = 0.0; (ulong)g0 < 3; g0 = (double)((long)g0 + 1)) {
        a[(long)g0 + -1] = w_madgwick[3] * a[(long)g0 + -1];
      }
      fsnav_linal_eul2mat(fsnav_ins_attitude_madgwick::C,&s);
      for (g0 = 0.0; (ulong)g0 < 9; g0 = (double)((long)g0 + 3)) {
        s = fsnav_ins_attitude_madgwick::L[(long)g0];
        a[0] = fsnav_ins_attitude_madgwick::L[(long)g0 + 1];
        a[1] = fsnav_ins_attitude_madgwick::L[(long)g0 + 2];
        fsnav_ins_attitude_madgwick::L[(long)g0] =
             a[1] * fsnav_ins_attitude_madgwick::C[2] +
             s * fsnav_ins_attitude_madgwick::C[0] + a[0] * fsnav_ins_attitude_madgwick::C[1];
        fsnav_ins_attitude_madgwick::L[(long)g0 + 1] =
             a[1] * fsnav_ins_attitude_madgwick::C[5] +
             s * fsnav_ins_attitude_madgwick::C[3] + a[0] * fsnav_ins_attitude_madgwick::C[4];
        fsnav_ins_attitude_madgwick::L[(long)g0 + 2] =
             a[1] * fsnav_ins_attitude_madgwick::C[8] +
             s * fsnav_ins_attitude_madgwick::C[6] + a[0] * fsnav_ins_attitude_madgwick::C[7];
      }
      fsnav_linal_mat2quat((fsnav->imu->sol).q,fsnav_ins_attitude_madgwick::L);
      (fsnav->imu->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((fsnav->imu->sol).rpy,fsnav_ins_attitude_madgwick::L);
      (fsnav->imu->sol).rpy_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_attitude_madgwick(void) {

	static double t0 = -1;  // начальное время
	static double
		C[9],               // переходная матрица
		*L;                 // указатель на матрицу ориентации навигационного решения

	char *cfg_ptr;                      // указатель на параметр в строке конфигурации
	const char madgwick_token[] = "madgwick_feedback_rate";
	static double feedback_rate = -1;   // настраиваемый параметр, рад/сек, ~sqrt(3)*(остаточный дрейф гироскопов)
	const double epsilon = 1.0/1048576; // 2^-20 ~ 1e-6 

	double
		a[3],
		s,
		dt,                         // шаг времени
		w_madgwick[4],              // угловая скорость
		a_madgwick[3],              // измерения акселерометров
		J_madgwick[3][4],           // якобиан
		f_madgwick[3],              // целевая функция
		vector1_4[4],               // grad(f)
		vector2_4[4];               // 2*dq/dt
	size_t i;                       // индекс

	// инициализация
	if (fsnav->mode == 0) {

		// проверка инерциальной подсистемы на шине
		if (fsnav->imu == NULL)
			return;
		// сброс флагов достоверности
		fsnav->imu->sol.q_valid = 0;
		fsnav->imu->sol.L_valid = 0;
		fsnav->imu->sol.rpy_valid = 0;
		// указатель на матрицу ориентации imu->sol
		L = fsnav->imu->sol.L;
		// единичный кватернион
		for (i = 1, fsnav->imu->sol.q[0] = 1; i < 4; i++)
			fsnav->imu->sol.q[i] = 0;
		fsnav->imu->sol.q_valid = 1;
		// матрица ориентации
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);
		fsnav->imu->sol.L_valid = 1;
		// углы ориентации, соответствующие матрице ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
		// обнуление начального времени
		t0 = -1;

		cfg_ptr = fsnav_locate_token(madgwick_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			feedback_rate = atof(cfg_ptr)/fsnav->imu_const.rad2deg;
		else
			return;

	}

	// завершение работы
	else if (fsnav->mode < 0) {}
	
	// операции на каждом шаге
	else {
		// проверка достоверности необходимых данных
		if (!fsnav->imu->sol.L_valid || !fsnav->imu->w_valid || !fsnav->imu->f_valid)
			return;
		// временнЫе переменные
		if (t0 < 0) {
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			w_madgwick[i+1] = fsnav->imu->w[i];

		for (i = 0, w_madgwick[0] = 0; i < 3; i++)
			a_madgwick[i] = fsnav->imu->f[i];

		double g0 = 0;
		double g1 = 0;
		double g2 = 1.0;
		// формирование целевой функции
		s = fsnav_linal_vnorm(a_madgwick, 3);
		f_madgwick[0] = 2.0*g0*(0.5 - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2])
		              + 2.0*g2*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2]) - a_madgwick[0]/s;
		f_madgwick[1] = 2.0*g0*(      fsnav->imu->sol.q[1]*fsnav->imu->sol.q[2] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[3]*fsnav->imu->sol.q[3])
		              + 2.0*g2*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1] + fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3]) - a_madgwick[1]/s;
		f_madgwick[2] = 2.0*g0*(      fsnav->imu->sol.q[0]*fsnav->imu->sol.q[2] + fsnav->imu->sol.q[1]*fsnav->imu->sol.q[3])
		              + 2.0*g1*(      fsnav->imu->sol.q[2]*fsnav->imu->sol.q[3] - fsnav->imu->sol.q[0]*fsnav->imu->sol.q[1])
		              + 2.0*g2*(0.5 - fsnav->imu->sol.q[1]*fsnav->imu->sol.q[1] - fsnav->imu->sol.q[2]*fsnav->imu->sol.q[2]) - a_madgwick[2]/s;
		// формирование якобиана
		J_madgwick[0][0] =  2.0*g1*fsnav->imu->sol.q[3] - 2.0*g2*fsnav->imu->sol.q[2]; 
		J_madgwick[0][1] =  2.0*g1*fsnav->imu->sol.q[2] + 2.0*g2*fsnav->imu->sol.q[3]; 
		J_madgwick[0][2] = -4.0*g0*fsnav->imu->sol.q[2] + 2.0*g1*fsnav->imu->sol.q[1] - 2.0*g2*fsnav->imu->sol.q[0]; 
		J_madgwick[0][3] = -4.0*g0*fsnav->imu->sol.q[3] + 2.0*g1*fsnav->imu->sol.q[0] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][0] = -2.0*g0*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[1][1] =  2.0*g0*fsnav->imu->sol.q[2] - 4.0*g1*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[0];
		J_madgwick[1][2] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g2*fsnav->imu->sol.q[3];
		J_madgwick[1][3] = -2.0*g0*fsnav->imu->sol.q[0] - 4.0*g1*fsnav->imu->sol.q[3] + 2.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][0] =  2.0*g0*fsnav->imu->sol.q[2] - 2.0*g1*fsnav->imu->sol.q[1];
		J_madgwick[2][1] =  2.0*g0*fsnav->imu->sol.q[3] - 2.0*g1*fsnav->imu->sol.q[0] - 4.0*g2*fsnav->imu->sol.q[1];
		J_madgwick[2][2] =  2.0*g0*fsnav->imu->sol.q[0] + 2.0*g1*fsnav->imu->sol.q[3] - 4.0*g2*fsnav->imu->sol.q[2];
		J_madgwick[2][3] =  2.0*g0*fsnav->imu->sol.q[1] + 2.0*g1*fsnav->imu->sol.q[2];
		
		for (i = 0; i < 4; i++)
			vector1_4[i] = J_madgwick[0][i]*f_madgwick[0] + J_madgwick[1][i]*f_madgwick[1] + J_madgwick[2][i]*f_madgwick[2];

		fsnav_linal_qmul(vector2_4, fsnav->imu->sol.q, w_madgwick);
		// интегрирование
		for (i = 0; i < 4; i++) // для избежания деления на ноль
			fsnav->imu->sol.q[i] += 0.5*(vector2_4[i] - feedback_rate*vector1_4[i]/(epsilon + fsnav_linal_vnorm(vector1_4,4)))*dt;

		// норма
		s = fsnav_linal_vnorm(fsnav->imu->sol.q, 4);
		for (i = 0; i < 4; i++)
			fsnav->imu->sol.q[i] /= s;

		// L = L(q)
		fsnav_linal_quat2mat(L, fsnav->imu->sol.q);

		// опорный трёхгранник
		// a <- c = (W + u)*dt
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->W_valid ? fsnav->imu->W[i] : 0;
		if (fsnav->imu->sol.llh_valid) {
			a[1] += fsnav->imu_const.u*cos(fsnav->imu->sol.llh[1]);
			a[2] += fsnav->imu_const.u*sin(fsnav->imu->sol.llh[1]);
		}
		for (i = 0; i < 3; i++)
			a[i] *= dt;
		// L = L*(E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2)^T
		fsnav_linal_eul2mat(C, a);	// C = E + [c x]*sin(c)/|c| + [c x]^2*(1-cos(c))/|c|^2
		for (i = 0; i < 9; i += 3) { // L = L*C^T
			a[0] = L[i+0];
			a[1] = L[i+1]; 
			a[2] = L[i+2];
			L[i+0] = a[0]*C[0] + a[1]*C[1] + a[2]*C[2];
			L[i+1] = a[0]*C[3] + a[1]*C[4] + a[2]*C[5];
			L[i+2] = a[0]*C[6] + a[1]*C[7] + a[2]*C[8];
		}
		// обновление кватерниона ориентации
		fsnav_linal_mat2quat(fsnav->imu->sol.q, L);
		fsnav->imu->sol.q_valid = 1;
		// обновление углов ориентации
		fsnav_linal_mat2rpy(fsnav->imu->sol.rpy, L);
		fsnav->imu->sol.rpy_valid = 1;
	}
}